

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  GLFWvidmode *pGVar3;
  GLFWwindow *handle;
  float fVar4;
  double dVar5;
  undefined1 auVar6 [16];
  bool local_65;
  GLFWvidmode *mode;
  GLFWwindow *window;
  GLFWmonitor *monitor;
  int fullscreen;
  double current_time;
  double last_time;
  unsigned_long frame_count;
  float position;
  int height;
  int width;
  int ch;
  char **argv_local;
  int argc_local;
  
  last_time = 0.0;
  bVar1 = false;
  window = (GLFWwindow *)0x0;
  while (iVar2 = getopt(argc,argv,"fh"), iVar2 != -1) {
    if (iVar2 == 0x66) {
      bVar1 = true;
    }
    else if (iVar2 == 0x68) {
      usage();
      exit(0);
    }
  }
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    exit(1);
  }
  if (bVar1) {
    window = (GLFWwindow *)glfwGetPrimaryMonitor();
    pGVar3 = glfwGetVideoMode((GLFWmonitor *)window);
    glfwWindowHint(0x21001,pGVar3->redBits);
    glfwWindowHint(0x21002,pGVar3->greenBits);
    glfwWindowHint(0x21003,pGVar3->blueBits);
    glfwWindowHint(0x2100f,pGVar3->refreshRate);
    position = (float)pGVar3->width;
    frame_count._4_4_ = pGVar3->height;
  }
  else {
    position = 8.96831e-43;
    frame_count._4_4_ = 0x1e0;
  }
  handle = glfwCreateWindow((int)position,frame_count._4_4_,"",(GLFWmonitor *)window,
                            (GLFWwindow *)0x0);
  if (handle != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(handle);
    gladLoadGLLoader(glfwGetProcAddress);
    set_swap_interval(handle,0);
    current_time = glfwGetTime();
    frame_rate = 0.0;
    iVar2 = glfwExtensionSupported("WGL_EXT_swap_control_tear");
    local_65 = true;
    if (iVar2 == 0) {
      iVar2 = glfwExtensionSupported("GLX_EXT_swap_control_tear");
      local_65 = iVar2 != 0;
    }
    swap_tear = (int)local_65;
    glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
    glfwSetKeyCallback(handle,key_callback);
    (*glad_glMatrixMode)(0x1701);
    (*glad_glOrtho)(-1.0,1.0,-1.0,1.0,1.0,-1.0);
    (*glad_glMatrixMode)(0x1700);
    while (iVar2 = glfwWindowShouldClose(handle), iVar2 == 0) {
      (*glad_glClear)(0x4000);
      dVar5 = glfwGetTime();
      fVar4 = cosf((float)dVar5 * 4.0);
      (*glad_glRectf)(fVar4 * 0.75 - 0.25,-1.0,fVar4 * 0.75 + 0.25,1.0);
      glfwSwapBuffers(handle);
      glfwPollEvents();
      last_time = (double)((long)last_time + 1);
      dVar5 = glfwGetTime();
      if (1.0 < dVar5 - current_time) {
        auVar6._8_4_ = (int)((ulong)last_time >> 0x20);
        auVar6._0_8_ = last_time;
        auVar6._12_4_ = 0x45300000;
        frame_rate = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,SUB84(last_time,0)) - 4503599627370496.0)) /
                     (dVar5 - current_time);
        last_time = 0.0;
        update_window_title(handle);
        current_time = dVar5;
      }
    }
    glfwTerminate();
    exit(0);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    float position;
    unsigned long frame_count = 0;
    double last_time, current_time;
    int fullscreen = GLFW_FALSE;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen)
    {
        const GLFWvidmode* mode;

        monitor = glfwGetPrimaryMonitor();
        mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    window = glfwCreateWindow(width, height, "", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    set_swap_interval(window, 0);

    last_time = glfwGetTime();
    frame_rate = 0.0;
    swap_tear = (glfwExtensionSupported("WGL_EXT_swap_control_tear") ||
                 glfwExtensionSupported("GLX_EXT_swap_control_tear"));

    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetKeyCallback(window, key_callback);

    glMatrixMode(GL_PROJECTION);
    glOrtho(-1.f, 1.f, -1.f, 1.f, 1.f, -1.f);
    glMatrixMode(GL_MODELVIEW);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        position = cosf((float) glfwGetTime() * 4.f) * 0.75f;
        glRectf(position - 0.25f, -1.f, position + 0.25f, 1.f);

        glfwSwapBuffers(window);
        glfwPollEvents();

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
            update_window_title(window);
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}